

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * __thiscall
re2::PrefixSuccessor_abi_cxx11_(string *__return_storage_ptr__,re2 *this,StringPiece *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  allocator local_51;
  string limit;
  
  paVar1 = &limit.field_2;
  limit._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&limit,*(long *)this,(long)*(int *)(this + 8) + *(long *)this);
  bVar3 = false;
  uVar4 = (uint)limit._M_string_length;
  do {
    uVar5 = (ulong)(uVar4 - 1);
    while( true ) {
      if ((bVar3) || ((int)uVar4 < 1)) {
        if (bVar3) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)limit._M_dataplus._M_p == paVar1) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(limit.field_2._M_allocated_capacity._1_7_,limit.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = limit.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = limit._M_dataplus._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(limit.field_2._M_allocated_capacity._1_7_,limit.field_2._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = limit._M_string_length;
          limit._M_string_length = 0;
          limit.field_2._M_local_buf[0] = '\0';
          limit._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_51);
        }
        std::__cxx11::string::~string((string *)&limit);
        return __return_storage_ptr__;
      }
      cVar2 = limit._M_dataplus._M_p[uVar5];
      bVar3 = cVar2 != -1;
      if (cVar2 == -1) break;
      limit._M_dataplus._M_p[uVar5] = cVar2 + '\x01';
    }
    std::__cxx11::string::erase((ulong)&limit,uVar5);
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

string PrefixSuccessor(const StringPiece& prefix) {
  // We can increment the last character in the string and be done
  // unless that character is 255, in which case we have to erase the
  // last character and increment the previous character, unless that
  // is 255, etc. If the string is empty or consists entirely of
  // 255's, we just return the empty string.
  bool done = false;
  string limit(prefix.data(), prefix.size());
  int index = static_cast<int>(limit.size()) - 1;
  while (!done && index >= 0) {
    if ((limit[index]&255) == 255) {
      limit.erase(index);
      index--;
    } else {
      limit[index]++;
      done = true;
    }
  }
  if (!done) {
    return "";
  } else {
    return limit;
  }
}